

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_event_declaration
                    (gravity_parser_t *parser,gtoken_t access_specifier,gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer_00;
  undefined1 auStack_50 [8];
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)auStack_50,lexer_00);
  if (token.value._4_4_ == TOK_KEY_EVENT) {
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x175da7);
    return (gnode_t *)0x0;
  }
  __assert_fail("type == TOK_KEY_EVENT",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                ,0x669,"gnode_t *parse_event_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
}

Assistant:

static gnode_t *parse_event_declaration (gravity_parser_t *parser, gtoken_t access_specifier, gtoken_t storage_specifier) {
    #pragma unused(parser, access_specifier, storage_specifier)

    // 'event' IDENTIFIER '(' parameter_declaration_clause? ')' ';'

    // NODE_EVENT_DECL
    DECLARE_LEXER;
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    assert(type == TOK_KEY_EVENT);

    REPORT_ERROR(token, "Event declarations not yet supported.");
    return NULL;
}